

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::addOptionHelp
          (QPDFArgParser *this,string *option_name,string *topic,string *short_text,
          string *long_text)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  logic_error *plVar4;
  element_type *peVar5;
  size_type sVar6;
  mapped_type *this_00;
  pointer ppVar7;
  mapped_type *pmVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  allocator<char> local_1a1;
  key_type local_1a0;
  _Base_ptr local_180;
  undefined1 local_178;
  HelpTopic local_170;
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Self local_98;
  _Self local_90;
  iterator ht;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_30;
  string *long_text_local;
  string *short_text_local;
  string *topic_local;
  string *option_name_local;
  QPDFArgParser *this_local;
  
  local_30 = long_text;
  long_text_local = short_text;
  short_text_local = topic;
  topic_local = option_name;
  option_name_local = (string *)this;
  uVar2 = std::__cxx11::string::length();
  if (2 < uVar2) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)topic_local);
    if (*pcVar3 == '-') {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)topic_local);
      if (*pcVar3 == '-') {
        peVar5 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                ::count(&peVar5->option_help,topic_local);
        if (sVar6 != 0) {
          QTC::TC("libtests","QPDFArgParser duplicate option help",0);
          ht._M_node._7_1_ = 1;
          plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_80,"QPDFArgParser: option ",topic_local);
          std::operator+(&local_60,&local_80," already has help");
          std::logic_error::logic_error(plVar4,(string *)&local_60);
          ht._M_node._7_1_ = 0;
          __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        peVar5 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        local_90._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
             ::find(&peVar5->help_topics,short_text_local);
        peVar5 = std::
                 __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        local_98._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
             ::end(&peVar5->help_topics);
        bVar1 = std::operator==(&local_90,&local_98);
        if (!bVar1) {
          HelpTopic::HelpTopic(&local_170,long_text_local,local_30);
          peVar5 = std::
                   __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
                    ::operator[](&peVar5->option_help,topic_local);
          HelpTopic::operator=(this_00,&local_170);
          HelpTopic::~HelpTopic(&local_170);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>
                   ::operator->(&local_90);
          pVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&(ppVar7->second).options,topic_local);
          local_180 = (_Base_ptr)pVar9.first._M_node;
          local_178 = pVar9.second;
          peVar5 = std::
                   __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"help",&local_1a1)
          ;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                   ::operator[](&peVar5->help_option_table,&local_1a0);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&pmVar8->choices,topic_local);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
          return;
        }
        QTC::TC("libtests","QPDFArgParser add to unknown topic",0);
        local_f9 = 1;
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_f8,"QPDFArgParser: unable to add option ",topic_local);
        std::operator+(&local_d8,&local_f8," to unknown help topic ");
        std::operator+(&local_b8,&local_d8,short_text_local);
        std::logic_error::logic_error(plVar4,(string *)&local_b8);
        local_f9 = 0;
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  QTC::TC("libtests","QPDFArgParser bad option for help",0);
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"QPDFArgParser: options for help must start with --");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFArgParser::addOptionHelp(
    std::string const& option_name,
    std::string const& topic,
    std::string const& short_text,
    std::string const& long_text)
{
    if (!((option_name.length() > 2) && (option_name.at(0) == '-') && (option_name.at(1) == '-'))) {
        QTC::TC("libtests", "QPDFArgParser bad option for help");
        throw std::logic_error("QPDFArgParser: options for help must start with --");
    }
    if (m->option_help.count(option_name)) {
        QTC::TC("libtests", "QPDFArgParser duplicate option help");
        throw std::logic_error("QPDFArgParser: option " + option_name + " already has help");
    }
    auto ht = m->help_topics.find(topic);
    if (ht == m->help_topics.end()) {
        QTC::TC("libtests", "QPDFArgParser add to unknown topic");
        throw std::logic_error(
            "QPDFArgParser: unable to add option " + option_name + " to unknown help topic " +
            topic);
    }
    m->option_help[option_name] = HelpTopic(short_text, long_text);
    ht->second.options.insert(option_name);
    m->help_option_table["help"].choices.insert(option_name);
}